

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

float calculateNoise(Mat *inputImg)

{
  double dVar1;
  int local_1c;
  int local_18;
  int j;
  int i;
  float numOfNoisy;
  Mat *inputImg_local;
  
  j = 0;
  for (local_18 = 0; local_18 < *(int *)(inputImg + 8); local_18 = local_18 + 1) {
    for (local_1c = 0; local_1c < *(int *)(inputImg + 0xc); local_1c = local_1c + 1) {
      dVar1 = getVariance(inputImg,local_18,local_1c);
      if (450.0 < dVar1) {
        j = (int)((float)j + 1.0);
      }
    }
  }
  return ((float)j / (float)(*(int *)(inputImg + 8) * *(int *)(inputImg + 0xc))) * 100.0;
}

Assistant:

float calculateNoise(Mat inputImg) {
    float numOfNoisy = 0.0;
    for (int i = 0; i < inputImg.rows; i ++) {
        for (int j = 0; j < inputImg.cols; j++) {
            if ( getVariance(inputImg, i, j)  > 450) {
                numOfNoisy++;
            }
        }
    }
    return  ( numOfNoisy / (inputImg.rows * inputImg.cols) ) * 100;
}